

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward>::
TemplateFuncCaseFactory(TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward> *this)

{
  TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::FaceForward> *this_local;
  
  FuncCaseFactory::FuncCaseFactory(&this->super_FuncCaseFactory);
  (this->super_FuncCaseFactory).super_CaseFactory._vptr_CaseFactory =
       (_func_int **)&PTR__TemplateFuncCaseFactory_01678390;
  return;
}

Assistant:

MovePtr<TestNode>	createCase		(const CaseContext& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "scalar", instance<GenF<1> >()));
		group->addChild(createFuncCase(ctx, "vec2", instance<GenF<2> >()));
		group->addChild(createFuncCase(ctx, "vec3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "vec4", instance<GenF<4> >()));

		return MovePtr<TestNode>(group);
	}